

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_srv.c
# Opt level: O1

int ssl_parse_client_psk_identity(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  mbedtls_ssl_config *pmVar1;
  int iVar2;
  uchar *A;
  ulong uVar3;
  ushort *puVar4;
  ulong uVar5;
  uchar diff;
  byte local_19;
  
  pmVar1 = ssl->conf;
  if (pmVar1->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
    if (pmVar1->psk == (uchar *)0x0) {
      return -0x7600;
    }
    if (pmVar1->psk_identity == (uchar *)0x0) {
      return -0x7600;
    }
    if (pmVar1->psk_identity_len == 0) {
      return -0x7600;
    }
    if (pmVar1->psk_len == 0) {
      return -0x7600;
    }
  }
  puVar4 = (ushort *)*p;
  if ((long)end - (long)puVar4 < 2) {
    return -0x7c00;
  }
  uVar5 = (ulong)(ushort)(*puVar4 << 8 | *puVar4 >> 8);
  puVar4 = puVar4 + 1;
  *p = (uchar *)puVar4;
  if ((ulong)((long)end - (long)puVar4) <= uVar5 - 1) {
    return -0x7c00;
  }
  pmVar1 = ssl->conf;
  if (pmVar1->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
    if (uVar5 == pmVar1->psk_identity_len) {
      local_19 = 0;
      uVar3 = 0;
      do {
        local_19 = local_19 | pmVar1->psk_identity[uVar3] ^ *(byte *)((long)puVar4 + uVar3);
        uVar3 = uVar3 + 1;
      } while (uVar5 != uVar3);
      if (local_19 == 0) goto LAB_0011dcd4;
    }
  }
  else {
    iVar2 = (*pmVar1->f_psk)(pmVar1->p_psk,ssl,(uchar *)puVar4,uVar5);
    if (iVar2 == 0) {
LAB_0011dcd4:
      *p = *p + uVar5;
      return 0;
    }
  }
  mbedtls_ssl_send_alert_message(ssl,'\x02','s');
  return -0x6c80;
}

Assistant:

static int ssl_parse_client_psk_identity( mbedtls_ssl_context *ssl, unsigned char **p,
                                          const unsigned char *end )
{
    int ret = 0;
    size_t n;

    if( ssl->conf->f_psk == NULL &&
        ( ssl->conf->psk == NULL || ssl->conf->psk_identity == NULL ||
          ssl->conf->psk_identity_len == 0 || ssl->conf->psk_len == 0 ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "got no pre-shared key" ) );
        return( MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED );
    }

    /*
     * Receive client pre-shared key identity name
     */
    if( end - *p < 2 )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    n = ( (*p)[0] << 8 ) | (*p)[1];
    *p += 2;

    if( n < 1 || n > 65535 || n > (size_t) ( end - *p ) )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "bad client key exchange message" ) );
        return( MBEDTLS_ERR_SSL_BAD_HS_CLIENT_KEY_EXCHANGE );
    }

    if( ssl->conf->f_psk != NULL )
    {
        if( ssl->conf->f_psk( ssl->conf->p_psk, ssl, *p, n ) != 0 )
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
    }
    else
    {
        /* Identity is not a big secret since clients send it in the clear,
         * but treat it carefully anyway, just in case */
        if( n != ssl->conf->psk_identity_len ||
            mbedtls_ssl_safer_memcmp( ssl->conf->psk_identity, *p, n ) != 0 )
        {
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
        }
    }

    if( ret == MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY )
    {
        MBEDTLS_SSL_DEBUG_BUF( 3, "Unknown PSK identity", *p, n );
        mbedtls_ssl_send_alert_message( ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                        MBEDTLS_SSL_ALERT_MSG_UNKNOWN_PSK_IDENTITY );
        return( MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY );
    }

    *p += n;

    return( 0 );
}